

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O2

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CNegativeExpression *expression)

{
  IExpression *pIVar1;
  ISubtreeWrapper *pIVar2;
  ISubtreeWrapper *_wrapper;
  __uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> local_18;
  
  std::operator<<((ostream *)&std::cout,"IRT builder: CNegativeExpression\n");
  pIVar1 = (expression->expression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  _wrapper = (ISubtreeWrapper *)operator_new(0x10);
  pIVar2 = (this->wrapper)._M_t.
           super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
           _M_t.
           super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
           .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  _wrapper->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_0017b608;
  _wrapper[1]._vptr_ISubtreeWrapper = (_func_int **)pIVar2;
  local_18._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl =
       (tuple<IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>)
       (_Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>)0x0;
  updateSubtreeWrapper(this,_wrapper);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
            ((unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> *)
             &local_18);
  return;
}

Assistant:

void CBuildVisitor::Visit( CNegativeExpression &expression ) {
    std::cout << "IRT builder: CNegativeExpression\n";
    expression.expression->Accept( *this );

    updateSubtreeWrapper( new IRT::CNegateConditionalWrapper(
            std::move( wrapper )
    ));
}